

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

void Acec_MatchCheckShift
               (Gia_Man_t *pGia0,Gia_Man_t *pGia1,Vec_Wec_t *vLits0,Vec_Wec_t *vLits1,
               Vec_Int_t *vMap0,Vec_Int_t *vMap1,Vec_Wec_t *vRoots0,Vec_Wec_t *vRoots1)

{
  Vec_Int_t *pVVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Wec_t *vLits1_00;
  Vec_Wec_t *vLits2;
  char *__s;
  int i;
  Vec_Wec_t *pVVar6;
  Vec_Wec_t *p;
  long lVar7;
  Vec_Wec_t *local_40;
  
  local_40 = vRoots0;
  vLits1_00 = Acec_MatchCopy(vLits0,vMap0);
  vLits2 = Acec_MatchCopy(vLits1,vMap1);
  iVar3 = Acec_MatchCountCommon(vLits1_00,vLits2,0);
  iVar4 = Acec_MatchCountCommon(vLits1_00,vLits2,1);
  pVVar6 = vLits2;
  iVar5 = Acec_MatchCountCommon(vLits1_00,vLits2,-1);
  i = (int)pVVar6;
  if (iVar4 < iVar5 || iVar4 <= iVar3) {
    if (iVar5 <= iVar3 || iVar5 <= iVar4) goto LAB_0065b240;
    __s = "Shifted one level down.";
    local_40 = vRoots1;
    pVVar6 = vLits1;
    p = vLits2;
  }
  else {
    __s = "Shifted one level up.";
    pVVar6 = vLits0;
    p = vLits1_00;
  }
  Vec_WecInsertLevel(pVVar6,i);
  Vec_WecInsertLevel(local_40,i);
  Vec_WecInsertLevel(p,i);
  puts(__s);
LAB_0065b240:
  Acec_MoveDuplicates(vLits0,vLits1_00);
  Acec_MoveDuplicates(vLits1,vLits2);
  iVar3 = vLits1_00->nCap;
  if (0 < (long)iVar3) {
    pVVar1 = vLits1_00->pArray;
    lVar7 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar7);
  }
  if (vLits1_00->pArray != (Vec_Int_t *)0x0) {
    free(vLits1_00->pArray);
    vLits1_00->pArray = (Vec_Int_t *)0x0;
  }
  vLits1_00->nCap = 0;
  vLits1_00->nSize = 0;
  free(vLits1_00);
  iVar3 = vLits2->nCap;
  if (0 < (long)iVar3) {
    pVVar1 = vLits2->pArray;
    lVar7 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar7);
  }
  if (vLits2->pArray != (Vec_Int_t *)0x0) {
    free(vLits2->pArray);
    vLits2->pArray = (Vec_Int_t *)0x0;
  }
  vLits2->nCap = 0;
  vLits2->nSize = 0;
  free(vLits2);
  return;
}

Assistant:

void Acec_MatchCheckShift( Gia_Man_t * pGia0, Gia_Man_t * pGia1, Vec_Wec_t * vLits0, Vec_Wec_t * vLits1, Vec_Int_t * vMap0, Vec_Int_t * vMap1, Vec_Wec_t * vRoots0, Vec_Wec_t * vRoots1 )
{
    Vec_Wec_t * vRes0 = Acec_MatchCopy( vLits0, vMap0 );
    Vec_Wec_t * vRes1 = Acec_MatchCopy( vLits1, vMap1 );
    int nCommon      = Acec_MatchCountCommon( vRes0, vRes1,  0 );
    int nCommonPlus  = Acec_MatchCountCommon( vRes0, vRes1,  1 );
    int nCommonMinus = Acec_MatchCountCommon( vRes0, vRes1, -1 );
    if ( nCommonPlus >= nCommonMinus && nCommonPlus > nCommon )
    {
        Vec_WecInsertLevel( vLits0, 0 );
        Vec_WecInsertLevel( vRoots0, 0 );
        Vec_WecInsertLevel( vRes0, 0 );
        printf( "Shifted one level up.\n" );
    }
    else if ( nCommonMinus > nCommonPlus && nCommonMinus > nCommon )
    {
        Vec_WecInsertLevel( vLits1, 0 );
        Vec_WecInsertLevel( vRoots1, 0 );
        Vec_WecInsertLevel( vRes1, 0 );
        printf( "Shifted one level down.\n" );
    }
    Acec_MoveDuplicates( vLits0, vRes0 );
    Acec_MoveDuplicates( vLits1, vRes1 );

    //Vec_WecPrintLits( vLits1 );
    //printf( "Input literals:\n" );
    //Vec_WecPrintLits( vLits0 );
    //printf( "Equiv classes:\n" );
    //Vec_WecPrintLits( vRes0 );
    //printf( "Input literals:\n" );
    //Vec_WecPrintLits( vLits1 );
    //printf( "Equiv classes:\n" );
    //Vec_WecPrintLits( vRes1 );
    //Acec_VerifyClasses( pGia0, vLits0, vRes0 );
    //Acec_VerifyClasses( pGia1, vLits1, vRes1 );
    Vec_WecFree( vRes0 );
    Vec_WecFree( vRes1 );
}